

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_thread.h
# Opt level: O2

RK_S32 __thiscall Condition::timedwait(Condition *this,Mutex *mutex,RK_S64 timeout)

{
  int iVar1;
  long lVar2;
  timespec local_30;
  
  clock_gettime(5,&local_30);
  lVar2 = (timeout % 1000) * 1000000 + local_30.tv_nsec;
  local_30.tv_nsec = lVar2 % 1000000000;
  local_30.tv_sec = lVar2 / 1000000000 + timeout / 1000 + local_30.tv_sec;
  iVar1 = pthread_cond_timedwait((pthread_cond_t *)this,(pthread_mutex_t *)mutex,&local_30);
  return iVar1;
}

Assistant:

inline RK_S32 Condition::timedwait(Mutex* mutex, RK_S64 timeout)
{
    struct timespec ts;

    clock_gettime(CLOCK_REALTIME_COARSE, &ts);

    ts.tv_sec += timeout / 1000;
    ts.tv_nsec += (timeout % 1000) * 1000000;
    /* Prevent the out of range at nanoseconds field */
    ts.tv_sec += ts.tv_nsec / 1000000000;
    ts.tv_nsec %= 1000000000;

    return pthread_cond_timedwait(&mCond, &mutex->mMutex, &ts);
}